

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parser_increment(parser *parser)

{
  ulong uVar1;
  
  uVar1 = parser->pos;
  if (uVar1 <= parser->buffer_size) {
    if (parser->buffer[uVar1] == '\n') {
      parser->line_num = parser->line_num + 1;
      parser->col_num = 1;
    }
    else {
      parser->col_num = parser->col_num + 1;
    }
    parser->pos = uVar1 + 1;
  }
  return;
}

Assistant:

void parser_increment(struct parser *parser)
{
        if (parser->pos > parser->buffer_size) {
                return;
        }

        if (parser->buffer[parser->pos] == '\n') {
                ++parser->line_num;
                parser->col_num = 1;
        } else {
                ++parser->col_num;
        }

        ++parser->pos;
}